

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

String * __thiscall Json::Value::asString_abi_cxx11_(String *__return_storage_ptr__,Value *this)

{
  byte bVar1;
  uint uVar2;
  char *pcVar4;
  uint *__s;
  String SStack_1a8;
  OStringStream oss;
  size_t sVar3;
  
  bVar1 = (byte)*(ushort *)&this->bits_;
  if (5 < bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Type is not convertible to string");
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1a8);
  }
  switch(bVar1) {
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x13295c);
    break;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x13295c);
    break;
  case 3:
    valueToString_abi_cxx11_
              (__return_storage_ptr__,(Json *)0x11,(this->value_).real_,0,
               (&switchD_00128856::switchdataD_0013295c)[bVar1] + 0x13295c);
    break;
  case 4:
    __s = (uint *)(this->value_).string_;
    if (__s != (uint *)0x0) {
      if ((*(ushort *)&this->bits_ >> 8 & 1) == 0) {
        sVar3 = strlen((char *)__s);
        uVar2 = (uint)sVar3;
      }
      else {
        uVar2 = *__s;
        __s = __s + 1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s,(char *)((ulong)uVar2 + (long)__s));
      return __return_storage_ptr__;
    }
  case 0:
    pcVar4 = "";
    goto LAB_001288d1;
  case 5:
    pcVar4 = "false";
    if ((this->value_).bool_ != false) {
      pcVar4 = "true";
    }
LAB_001288d1:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&oss);
  }
  return __return_storage_ptr__;
}

Assistant:

String Value::asString() const {
  switch (type()) {
  case nullValue:
    return "";
  case stringValue: {
    if (value_.string_ == nullptr)
      return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->isAllocated(), this->value_.string_, &this_len,
                         &this_str);
    return String(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}